

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32_t res)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  pair<const_char_*,_int> pVar5;
  
  uVar3 = (ulong)res;
  pcVar1 = p + 2;
  lVar4 = -0x15;
  do {
    uVar2 = ((byte)pcVar1[-1] - 1 << ((char)lVar4 + 0x1cU & 0x1f)) + (int)uVar3;
    uVar3 = (ulong)uVar2;
    if (-1 < pcVar1[-1]) goto LAB_00227cfe;
    pcVar1 = pcVar1 + 1;
    lVar4 = lVar4 + 7;
  } while (lVar4 != 0);
  if (7 < (byte)p[4]) {
    return (pair<const_char_*,_int>)ZEXT816(0);
  }
  uVar2 = uVar2 + (uint)(byte)p[4] * 0x10000000 + 0xf0000000;
  pcVar1 = (char *)0x0;
  if (uVar2 < 0x7ffffff0) {
    pcVar1 = p + 5;
  }
  uVar3 = (ulong)uVar2;
  if (uVar2 >= 0x7ffffff0) {
    uVar3 = 0;
  }
LAB_00227cfe:
  pVar5._8_8_ = uVar3;
  pVar5.first = pcVar1;
  return pVar5;
}

Assistant:

std::pair<const char*, int32_t> ReadSizeFallback(const char* p, uint32_t res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8_t>(p[4]);
  if (PROTOBUF_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (PROTOBUF_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}